

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::collectRayTracingLinkerObjects
          (TGlslangToSpvTraverser *this)

{
  uint uVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  TIntermAggregate *pTVar6;
  undefined4 extraout_var;
  long *plVar7;
  long lVar8;
  TIntermNode **objSeq;
  undefined8 *puVar9;
  uint local_40 [2];
  long *local_38;
  
  pTVar6 = glslang::TIntermediate::findLinkerObjects(this->glslangIntermediate);
  iVar4 = (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar6);
  puVar9 = *(undefined8 **)(CONCAT44(extraout_var,iVar4) + 8);
  puVar2 = *(undefined8 **)(CONCAT44(extraout_var,iVar4) + 0x10);
  do {
    if (puVar9 == puVar2) {
      return;
    }
    plVar7 = (long *)(**(code **)(*(long *)*puVar9 + 0x60))();
    if ((plVar7 != (long *)0x0) &&
       (lVar8 = (**(code **)(*plVar7 + 0x108))(plVar7), (~*(uint *)(lVar8 + 0x1c) & 0xfff) != 0)) {
      lVar8 = (**(code **)(*plVar7 + 0x108))(plVar7);
      uVar1 = *(uint *)(lVar8 + 0x1c);
      lVar8 = (**(code **)(*plVar7 + 0x108))(plVar7);
      uVar5 = *(uint *)(lVar8 + 8) & 0x7f;
      if (uVar5 - 9 < 2) {
        bVar3 = false;
        lVar8 = 0;
      }
      else {
        if (uVar5 - 0xc < 2) {
          lVar8 = 1;
        }
        else {
          if (uVar5 != 0xe) {
            lVar8 = 0xffffffff;
            bVar3 = true;
            goto LAB_003c526f;
          }
          lVar8 = 2;
        }
        bVar3 = false;
      }
LAB_003c526f:
      if (!bVar3) {
        local_40[0] = uVar1 & 0xfff;
        local_38 = plVar7;
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,glslang::TIntermSymbol*>,std::allocator<std::pair<unsigned_int_const,glslang::TIntermSymbol*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_int,glslang::TIntermSymbol*>>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,glslang::TIntermSymbol*>,std::allocator<std::pair<unsigned_int_const,glslang::TIntermSymbol*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->locationToSymbol[lVar8]._M_h,local_40);
      }
    }
    puVar9 = puVar9 + 1;
  } while( true );
}

Assistant:

void TGlslangToSpvTraverser::collectRayTracingLinkerObjects()
{
    glslang::TIntermAggregate* linkerObjects = glslangIntermediate->findLinkerObjects();
    for (auto& objSeq : linkerObjects->getSequence()) {
        auto objNode = objSeq->getAsSymbolNode();
        if (objNode != nullptr) {
            if (objNode->getQualifier().hasLocation()) {
                unsigned int location = objNode->getQualifier().layoutLocation;
                auto st = objNode->getQualifier().storage;
                int set;
                switch (st)
                {
                case glslang::EvqPayload:
                case glslang::EvqPayloadIn:
                    set = 0;
                    break;
                case glslang::EvqCallableData:
                case glslang::EvqCallableDataIn:
                    set = 1;
                    break;

                case glslang::EvqHitObjectAttrNV:
                    set = 2;
                    break;

                default:
                    set = -1;
                }
                if (set != -1)
                    locationToSymbol[set].insert(std::make_pair(location, objNode));
            }
        }
    }
}